

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderDerivateTests.cpp
# Opt level: O0

Vec4 __thiscall
vkt::sr::anon_unknown_0::TriangleDerivateCaseInstance::getSurfaceThreshold
          (TriangleDerivateCaseInstance *this)

{
  int iVar1;
  long in_RSI;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 in_XMM1_Qa;
  Vector<float,_4> VVar2;
  Vec4 VVar3;
  Vector<int,_4> local_38;
  Vector<float,_4> local_28;
  TriangleDerivateCaseInstance *this_local;
  undefined1 auVar4 [12];
  undefined8 uVar5;
  
  iVar1 = *(int *)(*(long *)(in_RSI + 0x210) + 0x14);
  this_local = this;
  if (iVar1 == 0) {
    tcu::Vector<int,_4>::Vector(&local_38,1);
    tcu::Vector<int,_4>::asFloat((Vector<int,_4> *)&local_28);
    VVar2 = tcu::operator/((tcu *)this,&local_28,255.0);
  }
  else if (iVar1 == 1) {
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)this,0.0);
    VVar2.m_data[2] = (float)(int)in_XMM1_Qa;
    VVar2.m_data[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
    VVar2.m_data[0] = (float)(int)extraout_XMM0_Qa;
    VVar2.m_data[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  }
  else {
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)this,0.0);
    VVar2.m_data[2] = (float)(int)in_XMM1_Qa;
    VVar2.m_data[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
    VVar2.m_data[0] = (float)(int)extraout_XMM0_Qa_00;
    VVar2.m_data[1] = (float)(int)((ulong)extraout_XMM0_Qa_00 >> 0x20);
  }
  VVar3.m_data[0] = VVar2.m_data[0];
  auVar4._4_4_ = VVar2.m_data[1];
  register0x00001240 = VVar2.m_data[2];
  register0x00001244 = VVar2.m_data[3];
  return (Vec4)VVar3.m_data;
}

Assistant:

tcu::Vec4 TriangleDerivateCaseInstance::getSurfaceThreshold (void) const
{
	switch (m_definitions.surfaceType)
	{
		case SURFACETYPE_UNORM_FBO:				return tcu::IVec4(1).asFloat() / 255.0f;
		case SURFACETYPE_FLOAT_FBO:				return tcu::Vec4(0.0f);
		default:
			DE_ASSERT(false);
			return tcu::Vec4(0.0f);
	}
}